

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O3

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateBinRelation
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,OperatorKind OpKind,
          BasicValue *LHS,BasicValue *RHS)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  long *plVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  ulong uVar6;
  uint __val;
  CMMInterpreter *pCVar7;
  uint uVar8;
  BlockAST *pBVar9;
  uint __len;
  string __str;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _List_node_base *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  BasicValue local_68;
  
  pCVar7 = (CMMInterpreter *)local_e8;
  pBVar9 = (BlockAST *)(ulong)OpKind;
  if (LHS->Type == RHS->Type) {
    switch(OpKind) {
    case Less:
      bVar3 = cvm::BasicValue::operator<(LHS,RHS);
      break;
    case LessEqual:
      bVar3 = cvm::BasicValue::operator<=(LHS,RHS);
      break;
    case Equal:
      bVar3 = cvm::BasicValue::operator==(LHS,RHS);
      break;
    case NotEqual:
      bVar3 = cvm::BasicValue::operator!=(LHS,RHS);
      break;
    case Greater:
      bVar3 = cvm::BasicValue::operator>(LHS,RHS);
      break;
    case GreaterEqual:
      bVar3 = cvm::BasicValue::operator>=(LHS,RHS);
      break;
    default:
switchD_00111103_default:
      uVar8 = (uint)pBVar9;
      __val = -uVar8;
      if (0 < (int)uVar8) {
        __val = uVar8;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_001112eb;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_001112eb;
          }
          if (uVar5 < 10000) goto LAB_001112eb;
          uVar6 = uVar6 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_001112eb:
      pCVar7 = (CMMInterpreter *)(local_d8 + 0x10);
      local_d8._16_8_ = (BlockAST *)local_b8;
      std::__cxx11::string::_M_construct
                ((ulong)pCVar7,(char)__len - ((char)((ulong)pBVar9 >> 0x18) >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)&(((StatementAST *)local_d8._16_8_)->super_AST)._vptr_AST +
                         (ulong)(uVar8 >> 0x1f)),__len,__val);
      plVar4 = (long *)std::__cxx11::string::append((char *)pCVar7);
      local_e8._0_8_ = *plVar4;
      pBVar9 = (BlockAST *)(plVar4 + 2);
      if ((BlockAST *)local_e8._0_8_ == pBVar9) {
        local_d8._0_8_ = (pBVar9->super_StatementAST).super_AST._vptr_AST;
        local_d8._8_8_ = plVar4[3];
        local_e8._0_8_ = (BlockAST *)local_d8;
      }
      else {
        local_d8._0_8_ = (pBVar9->super_StatementAST).super_AST._vptr_AST;
      }
      local_e8._8_8_ = plVar4[1];
      *plVar4 = (long)pBVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      RuntimeError(pCVar7,(string *)local_e8);
      if ((BlockAST *)local_e8._0_8_ != (BlockAST *)local_d8) {
        operator_delete((void *)local_e8._0_8_);
      }
      if ((BlockAST *)local_d8._16_8_ != (BlockAST *)local_b8) {
        operator_delete((void *)local_d8._16_8_);
      }
      _Unwind_Resume(extraout_RAX);
    }
    __return_storage_ptr__->Type = BoolType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2).BoolVal = bVar3;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (1 < (RHS->Type - IntType | LHS->Type - IntType)) {
      pBVar9 = (BlockAST *)local_d8;
      local_e8._0_8_ = pBVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"relational operator should apply to identical type","");
      RuntimeError(pCVar7,(string *)local_e8);
      goto switchD_00111103_default;
    }
    local_68.field_2.DoubleVal = cvm::BasicValue::toDouble(LHS);
    paVar1 = &local_68.StrVal.field_2;
    local_68.Type = DoubleType;
    local_68.StrVal._M_string_length = 0;
    local_68.StrVal.field_2._M_local_buf[0] = '\0';
    local_68.ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.StrVal._M_dataplus._M_p = (pointer)paVar1;
    local_80 = (_Base_ptr)cvm::BasicValue::toDouble(RHS);
    local_b8._16_4_ = 2;
    local_98 = (_List_node_base *)0x0;
    local_90._M_local_buf[0] = _S_red;
    local_78 = (_Base_ptr)0x0;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0 = &local_90;
    evaluateBinRelation(__return_storage_ptr__,this,OpKind,&local_68,(BasicValue *)(local_b8 + 0x10)
                       );
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if (local_68.ArrayPtr.
        super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.ArrayPtr.
                 super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.StrVal._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.StrVal._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateBinRelation(BinaryOperatorAST::OperatorKind OpKind,
                                    cvm::BasicValue LHS, cvm::BasicValue RHS) {
  if (LHS.Type != RHS.Type) {
    if (LHS.isNumeric() && RHS.isNumeric()) {
      return evaluateBinRelation(OpKind, LHS.toDouble(), RHS.toDouble());
    }
    RuntimeError("relational operator should apply to identical type");
  }

  switch (OpKind) {
  default:
    RuntimeError(std::to_string(OpKind) +
        " is not a valid binary relational operation kind");
  case cmm::BinaryOperatorAST::Less:
    return LHS < RHS;
  case cmm::BinaryOperatorAST::LessEqual:
    return LHS <= RHS;
  case cmm::BinaryOperatorAST::Equal:
    return LHS == RHS;
  case cmm::BinaryOperatorAST::NotEqual:
    return LHS != RHS;
  case cmm::BinaryOperatorAST::Greater:
    return LHS > RHS;
  case cmm::BinaryOperatorAST::GreaterEqual:
    return LHS >= RHS;
  }
}